

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall phosg::Image::set_channel_width(Image *this,uint8_t new_width)

{
  uint8_t uVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  void *pvVar5;
  undefined8 uVar6;
  byte bVar7;
  void *pvVar8;
  runtime_error *this_00;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined1 uVar12;
  undefined2 uVar13;
  ulong uVar14;
  
  bVar7 = new_width * ' ' | (byte)(new_width - 8) >> 3;
  if ((7 < bVar7) || ((0x8bU >> (bVar7 & 0x1f) & 1) == 0)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this_00,"channel width must be 8, 16, 32, or 64");
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar1 = this->channel_width;
  if (uVar1 != new_width) {
    lVar10 = this->height * this->width;
    bVar2 = this->has_alpha;
    pvVar8 = malloc((ulong)(new_width >> 3) * ((ulong)bVar2 + 3) * lVar10);
    if (lVar10 != 0) {
      lVar10 = ((ulong)bVar2 + 3) * lVar10;
      pvVar5 = (this->data).raw;
      lVar9 = 0;
      do {
        switch(uVar1 << 5 | (byte)(uVar1 - 8) >> 3) {
        case 0:
          bVar7 = *(byte *)((long)pvVar5 + lVar9);
          uVar11 = (ulong)bVar7;
          if (new_width == '@') {
            uVar14 = (ulong)bVar7 << 8 |
                     (ulong)bVar7 << 0x10 |
                     (ulong)bVar7 << 0x18 |
                     uVar11 << 0x20 | uVar11 << 0x28 | uVar11 << 0x30 | uVar11 << 0x38;
LAB_001117ea:
            *(ulong *)((long)pvVar8 + lVar9 * 8) = uVar14 | uVar11;
          }
          else if (new_width == ' ') {
            *(uint *)((long)pvVar8 + lVar9 * 4) =
                 (uint)bVar7 << 8 | (uint)bVar7 << 0x10 | (uint)bVar7 << 0x18 | (uint)bVar7;
          }
          else if (new_width == '\x10') {
            *(ushort *)((long)pvVar8 + lVar9 * 2) = CONCAT11(bVar7,bVar7);
          }
          break;
        case 1:
          uVar3 = *(ushort *)((long)pvVar5 + lVar9 * 2);
          uVar11 = (ulong)uVar3;
          if (new_width == '@') {
            *(ulong *)((long)pvVar8 + lVar9 * 8) =
                 (ulong)uVar3 << 0x10 | uVar11 << 0x20 | uVar11 << 0x30 | uVar11;
          }
          else if (new_width == ' ') {
            *(uint *)((long)pvVar8 + lVar9 * 4) = CONCAT22(uVar3,uVar3);
          }
          else if (new_width == '\b') {
            *(char *)((long)pvVar8 + lVar9) = (char)(uVar3 >> 8);
          }
          break;
        case 3:
          uVar4 = *(uint *)((long)pvVar5 + lVar9 * 4);
          uVar11 = (ulong)uVar4;
          if (new_width == '@') {
            uVar14 = uVar11 << 0x20;
            goto LAB_001117ea;
          }
          if (new_width == '\x10') {
            uVar13 = (undefined2)(uVar4 >> 0x10);
LAB_0011181d:
            *(undefined2 *)((long)pvVar8 + lVar9 * 2) = uVar13;
          }
          else if (new_width == '\b') {
            uVar12 = (undefined1)(uVar4 >> 0x18);
LAB_0011174f:
            *(undefined1 *)((long)pvVar8 + lVar9) = uVar12;
          }
          break;
        case 7:
          uVar6 = *(undefined8 *)((long)pvVar5 + lVar9 * 8);
          if (new_width == ' ') {
            *(int *)((long)pvVar8 + lVar9 * 4) = (int)((ulong)uVar6 >> 0x20);
          }
          else {
            if (new_width == '\x10') {
              uVar13 = (undefined2)((ulong)uVar6 >> 0x30);
              goto LAB_0011181d;
            }
            if (new_width == '\b') {
              uVar12 = (undefined1)((ulong)uVar6 >> 0x38);
              goto LAB_0011174f;
            }
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar10 + (ulong)(lVar10 == 0) != lVar9);
    }
    free((this->data).raw);
    (this->data).raw = pvVar8;
    this->channel_width = new_width;
    this->max_value = 0xffffffffffffffff >> (-new_width & 0x3f);
  }
  return;
}

Assistant:

void Image::set_channel_width(uint8_t new_width) {
  if (new_width != 8 && new_width != 16 && new_width != 32 && new_width != 64) {
    throw runtime_error("channel width must be 8, 16, 32, or 64");
  }
  if (this->channel_width == new_width) {
    return;
  }

  DataPtrs new_data;
  new_data.raw = malloc(this->width * this->height * (3 + this->has_alpha) * (new_width / 8));

  size_t value_count = this->width * this->height * (this->has_alpha ? 4 : 3);
  for (size_t z = 0; z < value_count; z++) {
    uint64_t v;
    // If the new channel width is larger than the current width, expand the
    // channels by copying the now-high bits to the lower bits. If the new
    // channel width is smaller, preserve only the high bits of the original
    // values.
    if (this->channel_width == 8) {
      v = this->data.as8[z];
      if (new_width == 16) {
        new_data.as16[z] = (v << 8) | v;
      } else if (new_width == 32) {
        new_data.as32[z] = (v << 24) | (v << 16) | (v << 8) | v;
      } else if (new_width == 64) {
        new_data.as64[z] = (v << 56) | (v << 48) | (v << 40) | (v << 32) | (v << 24) | (v << 16) | (v << 8) | v;
      }

    } else if (this->channel_width == 16) {
      v = this->data.as16[z];
      if (new_width == 8) {
        new_data.as8[z] = v >> 8;
      } else if (new_width == 32) {
        new_data.as32[z] = (v << 16) | v;
      } else if (new_width == 64) {
        new_data.as64[z] = (v << 48) | (v << 32) | (v << 16) | v;
      }

    } else if (this->channel_width == 32) {
      v = this->data.as32[z];
      if (new_width == 8) {
        new_data.as8[z] = v >> 24;
      } else if (new_width == 16) {
        new_data.as16[z] = v >> 16;
      } else if (new_width == 64) {
        new_data.as64[z] = (v << 32) | v;
      }

    } else if (this->channel_width == 64) {
      v = this->data.as64[z];
      if (new_width == 8) {
        new_data.as8[z] = v >> 56;
      } else if (new_width == 16) {
        new_data.as16[z] = v >> 48;
      } else if (new_width == 32) {
        new_data.as32[z] = v >> 32;
      }
    }
  }

  free(this->data.raw);
  this->data.raw = new_data.raw;
  this->channel_width = new_width;
  this->max_value = mask_for_width(this->channel_width);
}